

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitHop.c
# Opt level: O0

Hop_Obj_t * Kit_CoverToHop(Hop_Man_t *pMan,Vec_Int_t *vCover,int nVars,Vec_Int_t *vMemory)

{
  Kit_Graph_t *pGraph_00;
  Hop_Obj_t *pHVar1;
  Hop_Obj_t *pFunc;
  Kit_Graph_t *pGraph;
  Vec_Int_t *vMemory_local;
  int nVars_local;
  Vec_Int_t *vCover_local;
  Hop_Man_t *pMan_local;
  
  Vec_IntClear(vMemory);
  pGraph_00 = Kit_SopFactor(vCover,0,nVars,vMemory);
  pHVar1 = Kit_GraphToHop(pMan,pGraph_00);
  Kit_GraphFree(pGraph_00);
  return pHVar1;
}

Assistant:

Hop_Obj_t * Kit_CoverToHop( Hop_Man_t * pMan, Vec_Int_t * vCover, int nVars, Vec_Int_t * vMemory )
{
    Kit_Graph_t * pGraph;
    Hop_Obj_t * pFunc;
    // perform factoring
    Vec_IntClear( vMemory );
    pGraph = Kit_SopFactor( vCover, 0, nVars, vMemory );
    // convert graph to the AIG
    pFunc = Kit_GraphToHop( pMan, pGraph );
    Kit_GraphFree( pGraph );
    return pFunc;
}